

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestSampleResultValid<tcu::IntLookupPrecision,int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,Vec3 *coord,
               Vector<int,_4> *result)

{
  WrapMode WVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  deInt32 dVar10;
  float fVar11;
  undefined1 local_90 [8];
  Vector<int,_4> color;
  int z;
  int y;
  int x;
  int i;
  int j;
  int k;
  int maxK;
  int minK;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 wBounds;
  Vec2 vBounds;
  Vec2 uBounds;
  Vector<int,_4> *result_local;
  Vec3 *coord_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  fVar11 = Vector<float,_3>::x(coord);
  iVar4 = Vector<int,_3>::x(&prec->coordBits);
  iVar5 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),iVar3,fVar11,iVar4,iVar5);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  fVar11 = Vector<float,_3>::y(coord);
  iVar4 = Vector<int,_3>::y(&prec->coordBits);
  iVar5 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&wBounds,(bool)(bVar2 & 1),iVar3,fVar11,iVar4,iVar5);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getDepth(level);
  fVar11 = Vector<float,_3>::z(coord);
  iVar4 = Vector<int,_3>::z(&prec->coordBits);
  iVar5 = Vector<int,_3>::z(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),iVar3,fVar11,iVar4,iVar5);
  fVar11 = Vector<float,_2>::x(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar11);
  fVar11 = Vector<float,_2>::y(&vBounds);
  dVar7 = deFloorFloatToInt32(fVar11);
  fVar11 = Vector<float,_2>::x(&wBounds);
  dVar8 = deFloorFloatToInt32(fVar11);
  fVar11 = Vector<float,_2>::y(&wBounds);
  dVar9 = deFloorFloatToInt32(fVar11);
  fVar11 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  i = deFloorFloatToInt32(fVar11);
  fVar11 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar10 = deFloorFloatToInt32(fVar11);
  do {
    x = dVar8;
    if (dVar10 < i) {
      return false;
    }
    for (; y = dVar6, x <= dVar9; x = x + 1) {
      for (; y <= dVar7; y = y + 1) {
        WVar1 = sampler->wrapS;
        iVar3 = ConstPixelBufferAccess::getWidth(level);
        iVar3 = TexVerifierUtil::wrap(WVar1,y,iVar3);
        WVar1 = sampler->wrapT;
        iVar4 = ConstPixelBufferAccess::getHeight(level);
        color.m_data[3] = TexVerifierUtil::wrap(WVar1,x,iVar4);
        WVar1 = sampler->wrapR;
        iVar4 = ConstPixelBufferAccess::getDepth(level);
        color.m_data[2] = TexVerifierUtil::wrap(WVar1,i,iVar4);
        lookup<int>((tcu *)local_90,level,sampler,iVar3,color.m_data[3],color.m_data[2]);
        bVar2 = isColorValid(prec,(IVec4 *)local_90,result);
        if (bVar2) {
          return true;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const Vec3&							coord,
										const Vector<ScalarType, 4>&		result)
{
	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2		wBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getDepth(),	coord.z(), prec.coordBits.z(), prec.uvwBits.z());

	// Integer coordinates - without wrap mode
	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());
	const int		minJ			= deFloorFloatToInt32(vBounds.x());
	const int		maxJ			= deFloorFloatToInt32(vBounds.y());
	const int		minK			= deFloorFloatToInt32(wBounds.x());
	const int		maxK			= deFloorFloatToInt32(wBounds.y());

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int k = minK; k <= maxK; k++)
	{
		for (int j = minJ; j <= maxJ; j++)
		{
			for (int i = minI; i <= maxI; i++)
			{
				const int					x		= wrap(sampler.wrapS, i, level.getWidth());
				const int					y		= wrap(sampler.wrapT, j, level.getHeight());
				const int					z		= wrap(sampler.wrapR, k, level.getDepth());
				const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, y, z);

				if (isColorValid(prec, color, result))
					return true;
			}
		}
	}

	return false;
}